

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall
imrt::EvaluationFunction::update_beamlets_impact
          (EvaluationFunction *this,int o,int k,double prev_Dok)

{
  EvaluationFunction *pEVar1;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  Matrix *pMVar4;
  unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  *this_00;
  _List_node_base *p_Var5;
  long lVar6;
  pair<int,_int> bl;
  key_type local_70;
  EvaluationFunction *local_68;
  long local_60;
  long local_58;
  unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  *local_50;
  long local_48;
  double local_40;
  double local_38;
  
  local_70.second = k;
  local_70.first = o;
  local_68 = this;
  local_40 = prev_Dok;
  p_Var2 = (_List_node_base *)
           std::__detail::
           _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->voxel2beamlet_list,&local_70);
  pEVar1 = local_68;
  p_Var5 = p_Var2->_M_next;
  if (p_Var5 != p_Var2) {
    this_00 = &local_68->beamlet_impact;
    local_58 = (long)k;
    local_60 = (long)o * 3;
    local_48 = (long)o << 6;
    local_50 = this_00;
    do {
      local_70 = (key_type)p_Var5[1]._M_next;
      pmVar3 = std::__detail::
               _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_70);
      *pmVar3 = *pmVar3 - local_40;
      lVar6 = (long)local_70.second;
      pMVar4 = Volume::getDepositionMatrix
                         ((Volume *)
                          ((long)&((pEVar1->volumes->
                                   super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->collimator + local_48)
                          ,local_70.first);
      local_38 = *(double *)
                  (*(long *)((long)&(((pEVar1->D).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data + local_60 * 8) + local_58 * 8) *
                 pMVar4->p[local_58][lVar6];
      pmVar3 = std::__detail::
               _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_70);
      *pmVar3 = local_38 + *pmVar3;
      p_Var5 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var5 != p_Var2);
  }
  return;
}

Assistant:

void EvaluationFunction::update_beamlets_impact(int o, int k, double prev_Dok){
	list<pair <int,int> >& beamlets = voxel2beamlet_list[make_pair(o,k)];
	for(auto bl:beamlets){
		beamlet_impact[bl] -= prev_Dok;
		int angle = bl.first;
		int b = bl.second;
		const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		beamlet_impact[bl] += D[o][k] * Dep(k,b);
	}


}